

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_5450::Indent::Indent(Indent *this,string *current)

{
  pointer pcVar1;
  
  this->m_indent = current;
  (this->m_save)._M_dataplus._M_p = (pointer)&(this->m_save).field_2;
  pcVar1 = (current->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_save,pcVar1,pcVar1 + current->_M_string_length);
  std::__cxx11::string::append((char *)this->m_indent);
  return;
}

Assistant:

Indent(string& current)
            : m_indent(current), m_save(current)
        { m_indent += "  "; }